

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O1

void __thiscall OpenSSLWrapper::InitOpenSSL::InitOpenSSL(InitOpenSSL *this)

{
  char *pcVar1;
  char *__s;
  
  (this->strVersion)._M_dataplus._M_p = (pointer)&(this->strVersion).field_2;
  (this->strVersion)._M_string_length = 0;
  (this->strVersion).field_2._M_local_buf[0] = '\0';
  __s = (char *)OpenSSL_version(0);
  pcVar1 = (char *)(this->strVersion)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)__s);
  return;
}

Assistant:

InitOpenSSL::InitOpenSSL()
    {
#if OPENSSL_VERSION_NUMBER < 0x10100000L
        SSL_library_init();
        SSL_load_error_strings();
        strVersion = SSLeay_version(SSLEAY_VERSION);
#else
        strVersion = OpenSSL_version(OPENSSL_VERSION);
#endif

#if OPENSSL_VERSION_NUMBER < 0x10100000L
        ERR_load_BIO_strings();
        OpenSSL_add_all_algorithms();

        m_pmutLocks = make_unique<mutex[]>(CRYPTO_num_locks());
        CRYPTO_set_locking_callback(CbLocking);
#endif
    }